

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall
tinyusdz::
TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::
update(TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
       *this)

{
  pointer pSVar1;
  pointer pSVar2;
  long lVar3;
  ulong uVar4;
  
  pSVar1 = (this->_samples).
           super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->_samples).
           super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar1 != pSVar2) {
    uVar4 = ((long)pSVar2 - (long)pSVar1 >> 3) * -0x3333333333333333;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::Sample*,std::vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::Sample>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<tinyusdz::TypedTimeSamples<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::update()const::_lambda(tinyusdz::TypedTimeSamples<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::Sample_const&,tinyusdz::TypedTimeSamples<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::Sample_const&)_1_>>
              (pSVar1,pSVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    ::std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::Sample*,std::vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::Sample>>>,__gnu_cxx::__ops::_Iter_comp_iter<tinyusdz::TypedTimeSamples<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::update()const::_lambda(tinyusdz::TypedTimeSamples<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::Sample_const&,tinyusdz::TypedTimeSamples<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::Sample_const&)_1_>>
              (pSVar1,pSVar2);
  }
  this->_dirty = false;
  return;
}

Assistant:

void update() const {
    std::sort(_samples.begin(), _samples.end(),
              [](const Sample &a, const Sample &b) { return a.t < b.t; });

    _dirty = false;

    return;
  }